

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O3

bool mkvparser::Projection::Parse
               (IMkvReader *reader,longlong start,longlong size,Projection **projection)

{
  ulong uVar1;
  int iVar2;
  Projection *pPVar3;
  long lVar4;
  longlong lVar5;
  uchar *puVar6;
  bool bVar7;
  long lVar8;
  long stop;
  longlong read_pos;
  longlong child_size;
  double value;
  longlong child_id;
  long local_68;
  ulong local_60;
  double local_58;
  longlong local_50;
  Projection **local_48;
  uchar **local_40;
  Projection *local_38;
  
  if ((reader == (IMkvReader *)0x0) || (*projection != (Projection *)0x0)) {
    bVar7 = false;
  }
  else {
    local_48 = projection;
    pPVar3 = (Projection *)operator_new(0x28);
    pPVar3->type = kTypeNotPresent;
    local_40 = &pPVar3->private_data;
    pPVar3->private_data = (uchar *)0x0;
    pPVar3->private_data_length = 0;
    pPVar3->pose_yaw = 3.4028235e+38;
    pPVar3->pose_pitch = 3.4028235e+38;
    pPVar3->pose_roll = 3.4028235e+38;
    stop = size + start;
    local_68 = start;
    local_38 = pPVar3;
    do {
      bVar7 = stop <= local_68;
      if (stop <= local_68) {
        *local_48 = pPVar3;
        return bVar7;
      }
      local_50 = 0;
      local_60 = 0;
      lVar4 = ParseElementHeader(reader,&local_68,stop,&local_50,(longlong *)&local_60);
      lVar5 = local_50;
      uVar1 = local_60;
      lVar8 = local_68;
      if (lVar4 < 0) break;
      if (local_50 == 0x7672) {
        if ((local_60 - 0x80000001 < 0xffffffff80000000) ||
           (puVar6 = (uchar *)operator_new__(local_60,(nothrow_t *)&std::nothrow), lVar8 = local_68,
           puVar6 == (uchar *)0x0)) break;
        iVar2 = (**reader->_vptr_IMkvReader)(reader,local_68,uVar1,puVar6);
        if (iVar2 != 0) {
          operator_delete__(puVar6);
          break;
        }
        pPVar3->private_data = puVar6;
        pPVar3->private_data_length = uVar1;
      }
      else if (local_50 == 0x7671) {
        lVar5 = UnserializeUInt(reader,local_68,local_60);
        if (lVar5 < 0) break;
        pPVar3->type = (ProjectionType)lVar5;
      }
      else {
        local_58 = 0.0;
        lVar4 = UnserializeFloat(reader,local_68,local_60,&local_58);
        if (((lVar4 < 0) || (3.4028234663852886e+38 < ABS(local_58))) ||
           ((0.0 < local_58 && (local_58 < 1.1754943508222875e-38)))) break;
        if (lVar5 == 0x7675) {
          pPVar3->pose_roll = (float)local_58;
        }
        else if (lVar5 == 0x7674) {
          pPVar3->pose_pitch = (float)local_58;
        }
        else {
          if (lVar5 != 0x7673) break;
          pPVar3->pose_yaw = (float)local_58;
        }
      }
      local_68 = lVar8 + uVar1;
    } while (local_68 <= stop);
    if (*local_40 != (uchar *)0x0) {
      operator_delete__(*local_40);
    }
    operator_delete(pPVar3);
  }
  return bVar7;
}

Assistant:

bool Projection::Parse(IMkvReader* reader, long long start, long long size,
                       Projection** projection) {
  if (!reader || *projection)
    return false;

  std::unique_ptr<Projection> projection_ptr(new Projection());
  if (!projection_ptr.get())
    return false;

  const long long end = start + size;
  long long read_pos = start;

  while (read_pos < end) {
    long long child_id = 0;
    long long child_size = 0;

    const long long status =
        ParseElementHeader(reader, read_pos, end, child_id, child_size);
    if (status < 0)
      return false;

    if (child_id == libwebm::kMkvProjectionType) {
      long long projection_type = kTypeNotPresent;
      projection_type = UnserializeUInt(reader, read_pos, child_size);
      if (projection_type < 0)
        return false;

      projection_ptr->type = static_cast<ProjectionType>(projection_type);
    } else if (child_id == libwebm::kMkvProjectionPrivate) {
      unsigned char* data = SafeArrayAlloc<unsigned char>(1, child_size);

      if (data == NULL)
        return false;

      const int status =
          reader->Read(read_pos, static_cast<long>(child_size), data);

      if (status) {
        delete[] data;
        return false;
      }

      projection_ptr->private_data = data;
      projection_ptr->private_data_length = static_cast<size_t>(child_size);
    } else {
      double value = 0;
      const long long value_parse_status =
          UnserializeFloat(reader, read_pos, child_size, value);
      // Make sure value is representable as a float before casting.
      if (value_parse_status < 0 || value < -FLT_MAX || value > FLT_MAX ||
          (value > 0.0 && value < FLT_MIN)) {
        return false;
      }

      switch (child_id) {
        case libwebm::kMkvProjectionPoseYaw:
          projection_ptr->pose_yaw = static_cast<float>(value);
          break;
        case libwebm::kMkvProjectionPosePitch:
          projection_ptr->pose_pitch = static_cast<float>(value);
          break;
        case libwebm::kMkvProjectionPoseRoll:
          projection_ptr->pose_roll = static_cast<float>(value);
          break;
        default:
          return false;
      }
    }

    read_pos += child_size;
    if (read_pos > end)
      return false;
  }

  *projection = projection_ptr.release();
  return true;
}